

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<int>::AddKel
          (TPZMatrix<int> *this,TPZFMatrix<int> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int prevval;
  int local_64;
  TPZFMatrix<int> *local_60;
  TPZVec<long> *local_58;
  TPZVec<long> *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  lVar5 = source->fNElements;
  local_60 = elmat;
  local_58 = source;
  local_50 = destinationindex;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_40 = lVar5;
  if (iVar4 == 0) {
    if (0 < lVar5) {
      local_38 = 0;
      do {
        lVar5 = local_50->fStore[local_38];
        lVar1 = local_58->fStore[local_38];
        lVar6 = 0;
        local_48 = lVar5;
        do {
          lVar2 = local_50->fStore[lVar6];
          lVar3 = local_58->fStore[lVar6];
          local_64 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                               (this,lVar5,lVar2);
          lVar5 = local_48;
          if ((((lVar1 < 0) || ((local_60->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= lVar1))
              || (lVar3 < 0)) ||
             ((local_60->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar3)) {
            TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_64 = local_64 +
                     local_60->fElem
                     [lVar3 * (local_60->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow + lVar1];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,local_48,lVar2,&local_64);
          lVar6 = lVar6 + 1;
        } while (local_40 != lVar6);
        local_38 = local_38 + 1;
      } while (local_38 != local_40);
    }
  }
  else if (0 < lVar5) {
    lVar5 = 0;
    do {
      lVar1 = local_50->fStore[lVar5];
      lVar6 = local_58->fStore[lVar5];
      local_48 = lVar5;
      do {
        lVar2 = local_50->fStore[lVar5];
        lVar3 = local_58->fStore[lVar5];
        local_64 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                             (this,lVar1,lVar2);
        if (((lVar6 < 0) || ((local_60->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= lVar6)) ||
           ((lVar3 < 0 || ((local_60->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar3)))) {
          TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_64 = local_64 +
                   local_60->fElem
                   [lVar3 * (local_60->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow + lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar1,lVar2,&local_64);
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_40);
      lVar5 = local_48 + 1;
    } while (lVar5 != local_40);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}